

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

int64 __thiscall google::protobuf::io::StringOutputStream::ByteCount(StringOutputStream *this)

{
  LogMessage *other;
  string *psVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  psVar1 = this->target_;
  if (psVar1 == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xc6);
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
    psVar1 = this->target_;
  }
  return psVar1->_M_string_length;
}

Assistant:

int64 StringOutputStream::ByteCount() const {
  GOOGLE_CHECK(target_ != NULL);
  return target_->size();
}